

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomType.cpp
# Opt level: O1

void __thiscall
OpenMD::AtomType::addProperty(AtomType *this,shared_ptr<OpenMD::GenericData> *genData)

{
  element_type *peVar1;
  pointer pcVar2;
  mapped_type_conflict1 *pmVar3;
  shared_ptr<OpenMD::GenericData> local_58;
  key_type local_48;
  
  peVar1 = (genData->super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pcVar2 = (peVar1->id_)._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + (peVar1->id_)._M_string_length);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           ::operator[](&this->myResponsibilities_,&local_48);
  *pmVar3 = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_58.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (genData->super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_58.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (genData->super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if (local_58.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_58.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_58.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  PropertyMap::addProperty(&this->properties_,&local_58);
  if (local_58.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void AtomType::addProperty(std::shared_ptr<GenericData> genData) {
    myResponsibilities_[genData->getID()] = true;
    properties_.addProperty(genData);
  }